

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override.hpp
# Opt level: O2

method_result __thiscall boost::python::override::operator()(override *this,int *a0)

{
  undefined8 uVar1;
  _object *p_Var2;
  int *in_RDX;
  handle<_object> local_20;
  
  uVar1 = *(undefined8 *)a0;
  converter::arg_to_python<int>::arg_to_python((arg_to_python<int> *)&local_20,in_RDX);
  p_Var2 = (_object *)PyEval_CallFunction(uVar1,"(O)",local_20.m_p);
  p_Var2 = expect_non_null<_object>(p_Var2);
  *(_object **)this = p_Var2;
  handle<_object>::~handle(&local_20);
  return (method_result)(handle<_object>)this;
}

Assistant:

detail::method_result
operator()( BOOST_PP_ENUM_BINARY_PARAMS_Z(1, N, A, const& a) ) const
{
    detail::method_result x(
        PyEval_CallFunction(
            this->ptr()
          , const_cast<char*>("(" BOOST_PP_REPEAT_1ST(N, BOOST_PYTHON_FIXED, "O") ")")
            BOOST_PP_REPEAT_1ST(N, BOOST_PYTHON_fast_arg_to_python_get, nil)
        ));
    return x;
}